

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanUploadHeap.cpp
# Opt level: O1

void __thiscall
Diligent::VulkanUploadHeap::VulkanUploadHeap
          (VulkanUploadHeap *this,RenderDeviceVkImpl *RenderDevice,string *HeapName,
          VkDeviceSize PageSize)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->m_RenderDevice = RenderDevice;
  paVar1 = &(this->m_HeapName).field_2;
  (this->m_HeapName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (HeapName->_M_dataplus)._M_p;
  paVar2 = &HeapName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&HeapName->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_HeapName).field_2 + 8) = uVar4;
  }
  else {
    (this->m_HeapName)._M_dataplus._M_p = pcVar3;
    (this->m_HeapName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_HeapName)._M_string_length = HeapName->_M_string_length;
  (HeapName->_M_dataplus)._M_p = (pointer)paVar2;
  HeapName->_M_string_length = 0;
  (HeapName->field_2)._M_local_buf[0] = '\0';
  this->m_PageSize = PageSize;
  (this->m_Pages).
  super__Vector_base<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Pages).
  super__Vector_base<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Pages).
  super__Vector_base<Diligent::VulkanUploadHeap::UploadPageInfo,_std::allocator<Diligent::VulkanUploadHeap::UploadPageInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_CurrPage).vkBuffer = (VkBuffer)0x0;
  (this->m_CurrPage).CurrCPUAddress = (Uint8 *)0x0;
  (this->m_CurrPage).CurrOffset = 0;
  (this->m_CurrPage).AvailableSize = 0;
  this->m_CurrFrameSize = 0;
  this->m_PeakFrameSize = 0;
  this->m_CurrAllocatedSize = 0;
  this->m_PeakAllocatedSize = 0;
  return;
}

Assistant:

VulkanUploadHeap::VulkanUploadHeap(RenderDeviceVkImpl& RenderDevice,
                                   std::string         HeapName,
                                   VkDeviceSize        PageSize) :
    // clang-format off
    m_RenderDevice {RenderDevice       },
    m_HeapName     {std::move(HeapName)},
    m_PageSize     {PageSize           }
// clang-format on
{
}